

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O2

void __thiscall tfnw::TransferFunctionWidget::update_colormap(TransferFunctionWidget *this)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  float fVar9;
  float fVar10;
  
  this->gpu_image_stale = true;
  this->colormap_changed = true;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->current_colormap,
             &(this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>.
              _M_impl.super__Vector_impl_data._M_start[this->selected_colormap].colormap);
  uVar4 = (ulong)((long)(this->current_colormap).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->current_colormap).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  pvVar6 = (this->alpha_control_pts).
           super__Vector_base<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    fVar9 = (float)(long)uVar5 / (float)uVar4;
    pvVar1 = pvVar6 + 1;
    bVar2 = fVar9 != pvVar1->x;
    bVar3 = pvVar1->x <= fVar9;
    pvVar7 = pvVar6;
    if (bVar3 && bVar2) {
      pvVar7 = pvVar6 + 1;
    }
    pvVar8 = pvVar6 + 2;
    if ((NAN(fVar9) || NAN(pvVar1->x)) || (!bVar3 || !bVar2)) {
      pvVar8 = pvVar6 + 1;
    }
    fVar9 = (fVar9 - pvVar7->x) / (pvVar6[(ulong)(bVar3 && bVar2) + 1].x - pvVar7->x);
    fVar10 = ((1.0 - fVar9) * pvVar7->y + fVar9 * pvVar8->y) * 255.0;
    fVar9 = 255.0;
    if (fVar10 <= 255.0) {
      fVar9 = fVar10;
    }
    (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar5 * 4 + 3] =
         (uchar)(int)(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
    pvVar6 = pvVar7;
  }
  return;
}

Assistant:

void TransferFunctionWidget::update_colormap()
{
    colormap_changed = true;
    gpu_image_stale = true;
    current_colormap = colormaps[selected_colormap].colormap;
    // We only change opacities for now, so go through and update the opacity
    // by blending between the neighboring control points
    auto a_it = alpha_control_pts.begin();
    const size_t npixels = current_colormap.size() / 4;
    for (size_t i = 0; i < npixels; ++i) {
        float x = static_cast<float>(i) / npixels;
        auto high = a_it + 1;
        if (x > high->x) {
            ++a_it;
            ++high;
        }
        float t = (x - a_it->x) / (high->x - a_it->x);
        float alpha = (1.f - t) * a_it->y + t * high->y;
        current_colormap[i * 4 + 3] = static_cast<uint8_t>(clamp(alpha * 255.f, 0.f, 255.f));
    }
}